

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

drmp3_uint64
drmp3_src_read_frames_ex
          (drmp3_src *pSRC,drmp3_uint64 frameCount,void *pFramesOut,drmp3_bool32 flush)

{
  float *pFramesOut_00;
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  drmp3_src_algorithm dVar5;
  drmp3_uint64 dVar6;
  drmp3_uint64 dVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  
  if (pFramesOut == (void *)0x0 || (frameCount == 0 || pSRC == (drmp3_src *)0x0)) {
    return 0;
  }
  dVar5 = drmp3_src_algorithm_none;
  if ((pSRC->config).sampleRateIn != (pSRC->config).sampleRateOut) {
    dVar5 = (pSRC->config).algorithm;
  }
  if (dVar5 != drmp3_src_algorithm_linear) {
    if (dVar5 == drmp3_src_algorithm_none) {
      dVar6 = (*pSRC->onRead)(pSRC,frameCount,pFramesOut,pSRC->pUserData);
      return dVar6;
    }
    return 0;
  }
  if ((undefined1  [16])((undefined1  [16])pSRC->algo & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    dVar6 = drmp3_src_cache_read_frames(&pSRC->cache,1,pSRC->bin);
    if (dVar6 == 0) {
      return 0;
    }
    pbVar1 = (byte *)((long)&pSRC->algo + 8);
    *pbVar1 = *pbVar1 | 1;
  }
  if ((undefined1  [16])((undefined1  [16])pSRC->algo & (undefined1  [16])0x2) ==
      (undefined1  [16])0x0) {
    dVar6 = drmp3_src_cache_read_frames(&pSRC->cache,1,pSRC->bin + (pSRC->config).channels);
    if (dVar6 == 0) {
      return 0;
    }
    pbVar1 = (byte *)((long)&pSRC->algo + 8);
    *pbVar1 = *pbVar1 | 2;
  }
  if (frameCount == 0) {
    return 0;
  }
  uVar3 = (pSRC->config).sampleRateIn;
  uVar4 = (pSRC->config).sampleRateOut;
  dVar6 = 0;
  do {
    uVar11 = (ulong)(pSRC->config).channels;
    pFramesOut_00 = pSRC->bin + uVar11;
    if (uVar11 != 0) {
      fVar12 = (float)(pSRC->algo).linear.alpha;
      uVar8 = 0;
      do {
        *(float *)((long)pFramesOut + uVar8 * 4) =
             pSRC->bin[uVar8] * (1.0 - fVar12) + pFramesOut_00[uVar8] * fVar12;
        uVar8 = uVar8 + 1;
      } while (uVar11 != uVar8);
    }
    dVar13 = (pSRC->algo).linear.alpha + (double)uVar3 / (double)uVar4;
    uVar11 = (ulong)dVar13;
    uVar10 = (uint)uVar11;
    (pSRC->algo).linear.alpha = dVar13 - (double)(uVar11 & 0xffffffff);
    if (uVar10 != 0) {
      uVar9 = 0;
      do {
        uVar11 = (ulong)(pSRC->config).channels;
        if (uVar11 != 0) {
          uVar8 = 0;
          do {
            pSRC->bin[uVar8] = pFramesOut_00[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
        }
        dVar7 = drmp3_src_cache_read_frames(&pSRC->cache,1,pFramesOut_00);
        if (dVar7 == 0) {
          uVar11 = (ulong)(pSRC->config).channels;
          if (uVar11 != 0) {
            memset(pFramesOut_00,0,uVar11 << 2);
          }
          bVar2 = *(byte *)((long)&pSRC->algo + 8);
          if ((bVar2 & 2) != 0 || flush != 0) {
            *(byte *)((long)&pSRC->algo + 8) = ((bVar2 & 2) >> 1 | 0xfc) & bVar2;
          }
          break;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar10);
    }
    pFramesOut = (void *)((long)pFramesOut + (ulong)(pSRC->config).channels * 4);
    frameCount = frameCount - 1;
    dVar6 = dVar6 + 1;
    if ((undefined1  [16])((undefined1  [16])pSRC->algo & (undefined1  [16])0x2) ==
        (undefined1  [16])0x0) {
      if (flush == 0) {
        return dVar6;
      }
      if ((undefined1  [16])((undefined1  [16])pSRC->algo & (undefined1  [16])0x1) ==
          (undefined1  [16])0x0) {
        return dVar6;
      }
    }
    if (frameCount == 0) {
      return dVar6;
    }
  } while( true );
}

Assistant:

drmp3_uint64 drmp3_src_read_frames_ex(drmp3_src* pSRC, drmp3_uint64 frameCount, void* pFramesOut, drmp3_bool32 flush)
{
    if (pSRC == NULL || frameCount == 0 || pFramesOut == NULL) return 0;

    drmp3_src_algorithm algorithm = pSRC->config.algorithm;

    // Always use passthrough if the sample rates are the same.
    if (pSRC->config.sampleRateIn == pSRC->config.sampleRateOut) {
        algorithm = drmp3_src_algorithm_none;
    }

    // Could just use a function pointer instead of a switch for this...
    switch (algorithm)
    {
        case drmp3_src_algorithm_none:   return drmp3_src_read_frames_passthrough(pSRC, frameCount, pFramesOut, flush);
        case drmp3_src_algorithm_linear: return drmp3_src_read_frames_linear(pSRC, frameCount, pFramesOut, flush);
        default: return 0;
    }
}